

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

Vec_Int_t * Gia_ManFirstFanouts(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  bool bVar2;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vFans;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntStart(iVar1);
  local_24 = 0;
  while( true ) {
    bVar2 = false;
    if (local_24 < p->nObjs) {
      pGStack_20 = Gia_ManObj(p,local_24);
      bVar2 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsAnd(pGStack_20);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCo(pGStack_20);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFaninId0p(p,pGStack_20);
        iVar1 = Vec_IntEntry(p_00,iVar1);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjFaninId0p(p,pGStack_20);
          Vec_IntWriteEntry(p_00,iVar1,local_24);
        }
      }
    }
    else {
      iVar1 = Gia_ObjFaninId0p(p,pGStack_20);
      iVar1 = Vec_IntEntry(p_00,iVar1);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjFaninId0p(p,pGStack_20);
        Vec_IntWriteEntry(p_00,iVar1,local_24);
      }
      iVar1 = Gia_ObjFaninId1p(p,pGStack_20);
      iVar1 = Vec_IntEntry(p_00,iVar1);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjFaninId1p(p,pGStack_20);
        Vec_IntWriteEntry(p_00,iVar1,local_24);
      }
      iVar1 = Gia_ObjIsMuxId(p,local_24);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFaninId2p(p,pGStack_20);
        iVar1 = Vec_IntEntry(p_00,iVar1);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjFaninId2p(p,pGStack_20);
          Vec_IntWriteEntry(p_00,iVar1,local_24);
        }
      }
    }
    local_24 = local_24 + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManFirstFanouts( Gia_Man_t * p )
{
    Vec_Int_t * vFans = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( Vec_IntEntry(vFans, Gia_ObjFaninId0p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId0p(p, pObj), i);
            if ( Vec_IntEntry(vFans, Gia_ObjFaninId1p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId1p(p, pObj), i);
            if ( Gia_ObjIsMuxId(p, i) && Vec_IntEntry(vFans, Gia_ObjFaninId2p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId2p(p, pObj), i);
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            if ( Vec_IntEntry(vFans, Gia_ObjFaninId0p(p, pObj)) == 0 )
                Vec_IntWriteEntry(vFans, Gia_ObjFaninId0p(p, pObj), i);
        }
    }
    return vFans;
}